

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# puppet.hpp
# Opt level: O0

void henson::Puppet::exec(void *self_)

{
  code *pcVar1;
  undefined4 uVar2;
  time_type tVar3;
  reference ppcVar4;
  long in_RDI;
  Puppet *self;
  
  do {
    *(undefined1 *)(in_RDI + 0x20) = 1;
    tVar3 = get_time();
    *(time_type *)(in_RDI + 0x30) = tVar3;
    pcVar1 = *(code **)(in_RDI + 0xb0);
    uVar2 = *(undefined4 *)(in_RDI + 0x90);
    ppcVar4 = std::vector<char_*,_std::allocator<char_*>_>::operator[]
                        ((vector<char_*,_std::allocator<char_*>_> *)(in_RDI + 0x98),0);
    uVar2 = (*pcVar1)(uVar2,ppcVar4);
    *(undefined4 *)(in_RDI + 0x28) = uVar2;
    *(undefined1 *)(in_RDI + 0x20) = 0;
    Coroutine<henson::Puppet>::yield((Coroutine<henson::Puppet> *)0x2e358d);
  } while( true );
}

Assistant:

static void         exec(void* self_)
    {
        Puppet* self = (Puppet*) self_;

        while(true)
        {
            self->running_ = true;
            self->start_time_ = get_time();
            self->result_ = self->main_(self->argc_,&self->argv_[0]);
            self->running_ = false;
            self->yield();      // the time for the final portion will get recorded thanks to this call
        }
    }